

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::parse(Reader *this,istream *sin,Value *root,bool collectComments)

{
  bool bVar1;
  string doc;
  
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  doc._M_string_length = 0;
  doc.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>(sin,(string *)&doc,-1);
  bVar1 = parse(this,doc._M_dataplus._M_p,doc._M_dataplus._M_p + doc._M_string_length,root,
                collectComments);
  std::__cxx11::string::~string((string *)&doc);
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& sin, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(sin);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since JSONCPP_STRING is reference-counted, this at least does not
  // create an extra copy.
  JSONCPP_STRING doc;
  std::getline(sin, doc, (char)EOF);
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}